

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::fan_reduce<long>(Omega_h *this,LOs *a2b,Read<signed_char> *b_data,Int width,Omega_h_Op op)

{
  void *extraout_RDX;
  Write<int> *this_00;
  Write<int> *this_01;
  Read<signed_char> RVar1;
  Write<int> WStack_88;
  Write<int> local_78;
  Write<int> local_68;
  Write<int> local_58;
  Write<int> local_48;
  Write<int> local_38;
  
  this_00 = &WStack_88;
  if (op == OMEGA_H_SUM) {
    Write<int>::Write(&WStack_88,&a2b->write_);
    this_01 = &local_58;
    Write<long>::Write(this_01,(Write<int> *)b_data);
    fan_reduce_tmpl<Omega_h::SumFunctor<long>>
              (this,(LOs *)&WStack_88,(Read<signed_char> *)this_01,width);
  }
  else if (op == OMEGA_H_MAX) {
    Write<int>::Write(&local_78,&a2b->write_);
    this_01 = &local_48;
    Write<long>::Write(this_01,(Write<int> *)b_data);
    this_00 = &local_78;
    fan_reduce_tmpl<Omega_h::MaxFunctor<long>>
              (this,(LOs *)this_00,(Read<signed_char> *)this_01,width);
  }
  else {
    if (op != OMEGA_H_MIN) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
           ,0x144);
    }
    Write<int>::Write(&local_68,&a2b->write_);
    this_01 = &local_38;
    Write<long>::Write(this_01,(Write<int> *)b_data);
    this_00 = &local_68;
    fan_reduce_tmpl<Omega_h::MinFunctor<long>>
              (this,(LOs *)this_00,(Read<signed_char> *)this_01,width);
  }
  Write<long>::~Write((Write<long> *)this_01);
  Write<int>::~Write(this_00);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> fan_reduce(LOs a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  switch (op) {
    case OMEGA_H_MIN:
      return fan_reduce_tmpl<MinFunctor<T>>(a2b, b_data, width);
    case OMEGA_H_MAX:
      return fan_reduce_tmpl<MaxFunctor<T>>(a2b, b_data, width);
    case OMEGA_H_SUM:
      return fan_reduce_tmpl<SumFunctor<T>>(a2b, b_data, width);
  }
  OMEGA_H_NORETURN(Read<T>());
}